

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_vec3f ma_vec3f_neg(ma_vec3f a)

{
  undefined8 in_XMM0_Qa;
  float in_XMM1_Da;
  ma_vec3f mVar1;
  undefined4 local_20;
  undefined4 uStack_1c;
  
  local_20 = (float)in_XMM0_Qa;
  uStack_1c = (float)((ulong)in_XMM0_Qa >> 0x20);
  mVar1 = ma_vec3f_init_3f(-local_20,-uStack_1c,-in_XMM1_Da);
  return mVar1;
}

Assistant:

MA_API ma_vec3f ma_vec3f_neg(ma_vec3f a)
{
    return ma_vec3f_init_3f(
        -a.x,
        -a.y,
        -a.z
    );
}